

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_spec_tests.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  UnitTestSource *pUVar2;
  TestFlag *pTVar3;
  uint uVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  int iVar6;
  char **in_R9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  bool bVar8;
  AssertionResult iutest_ar_1;
  AssertionResult iutest_ar;
  int targc;
  char *targv [2];
  allocator<char> local_3d9;
  AssertionResult local_3d8;
  AssertionHelper local_3b0;
  int local_37c;
  int local_378;
  int local_374;
  char **local_370;
  undefined1 local_368 [392];
  int local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 local_1b8 [32];
  char *local_198;
  undefined8 local_190;
  ios_base aiStack_138 [264];
  
  iutest::detail::iuConsole::GetLoggerInstanceVariable()::sLogger = &logger;
  local_374 = 2;
  local_1d8 = *argv;
  local_1d0 = "--feature";
  local_370 = argv;
  pUVar2 = iutest::UnitTestSource::GetInstance();
  iutest::UnitTestSource::Initialize(pUVar2);
  iutest::TestEnv::ParseCommandLine<char_const>(&local_374,&local_1d8);
  iutest::TestEnv::LoadFlagFile();
  pUVar2 = iutest::UnitTestSource::GetInstance();
  iutest::UnitTestSource::SetUpDefaultXmlListener(pUVar2);
  pTVar3 = iutest::TestFlag::GetInstance();
  uVar4 = pTVar3->m_test_flags & 0x4000000;
  paVar7 = &local_3b0.m_part_result.super_iuCodeMessage.m_message.field_2;
  local_3b0.m_part_result.super_iuCodeMessage.m_message._M_string_length = 0;
  local_3b0.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[0] = '\0';
  local_3b0.m_part_result.super_iuCodeMessage.m_file =
       (char *)CONCAT71(local_3b0.m_part_result.super_iuCodeMessage.m_file._1_7_,
                        (byte)(uVar4 >> 0x1a));
  local_3b0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar7;
  if (uVar4 == 0) {
    memset((iu_global_format_stringstream *)local_368,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_368);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_3d8.m_message,(internal *)&local_3b0,
               (AssertionResult *)
               "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_FEATURE)","false","true",
               (char *)in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b8,local_3d8.m_message._M_dataplus._M_p,&local_3d9);
    local_198 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
    ;
    local_190 = 0x100000032;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)local_1b8,(Fixed *)local_368,false);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8.m_message._M_dataplus._M_p != &local_3d8.m_message.field_2) {
      operator_delete(local_3d8.m_message._M_dataplus._M_p,
                      local_3d8.m_message.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_368);
    std::ios_base::~ios_base((ios_base *)(local_368 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar7) {
    operator_delete(local_3b0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    CONCAT71(local_3b0.m_part_result.super_iuCodeMessage.m_message.field_2.
                             _M_allocated_capacity._1_7_,
                             local_3b0.m_part_result.super_iuCodeMessage.m_message.field_2.
                             _M_local_buf[0]) + 1);
  }
  logger.m_log._M_string_length = 0;
  *logger.m_log._M_dataplus._M_p = '\0';
  pUVar2 = iutest::UnitTestSource::GetInstance();
  local_378 = iutest::UnitTestSource::Run(pUVar2);
  local_368._0_8_ = logger.m_log._M_dataplus._M_p;
  iuutil::StrInHelper::Assertion<char[24],char_const*>
            (&local_3d8,(StrInHelper *)"\"IUTEST_HAS_TYPED_TEST_P\"","logger.c_str()",
             "IUTEST_HAS_TYPED_TEST_P",(char (*) [24])local_368,in_R9);
  bVar8 = local_3d8.m_result;
  iVar6 = 0;
  if (local_3d8.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::detail::iuStreamMessage::iuStreamMessage
              ((iuStreamMessage *)local_368,(iuStreamMessage *)local_1b8);
    local_1e0 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b0,local_3d8.m_message._M_dataplus._M_p,&local_3d9);
    local_3b0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
    ;
    local_3b0.m_part_result.super_iuCodeMessage.m_line = 0x36;
    local_3b0.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_3b0,(Fixed *)local_368,false);
    iVar6 = local_1e0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar7) {
      operator_delete(local_3b0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      CONCAT71(local_3b0.m_part_result.super_iuCodeMessage.m_message.field_2.
                               _M_allocated_capacity._1_7_,
                               local_3b0.m_part_result.super_iuCodeMessage.m_message.field_2.
                               _M_local_buf[0]) + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_368);
    std::ios_base::~ios_base((ios_base *)(local_368 + 0x80));
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(aiStack_138);
  }
  paVar7 = &local_3b0.m_part_result.super_iuCodeMessage.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8.m_message._M_dataplus._M_p != &local_3d8.m_message.field_2) {
    operator_delete(local_3d8.m_message._M_dataplus._M_p,
                    local_3d8.m_message.field_2._M_allocated_capacity + 1);
  }
  if (bVar8 == false) {
LAB_0010f15b:
    bVar8 = false;
  }
  else {
    local_368._0_8_ = logger.m_log._M_dataplus._M_p;
    iuutil::StrNotInHelper::Assertion<char[17],char_const*>
              (&local_3d8,(StrNotInHelper *)"\"IUTEST_HAS_TUPLE\"","logger.c_str()",
               "IUTEST_HAS_TUPLE",(char (*) [17])local_368,in_R9);
    bVar8 = local_3d8.m_result;
    if (local_3d8.m_result == false) {
      memset((iu_global_format_stringstream *)local_1b8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b8);
      iutest::detail::iuStreamMessage::iuStreamMessage
                ((iuStreamMessage *)local_368,(iuStreamMessage *)local_1b8);
      local_1e0 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3b0,local_3d8.m_message._M_dataplus._M_p,&local_3d9);
      local_3b0.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
      ;
      local_3b0.m_part_result.super_iuCodeMessage.m_line = 0x37;
      local_3b0.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_3b0,(Fixed *)local_368,false);
      local_37c = local_1e0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar7) {
        operator_delete(local_3b0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        CONCAT71(local_3b0.m_part_result.super_iuCodeMessage.m_message.field_2.
                                 _M_allocated_capacity._1_7_,
                                 local_3b0.m_part_result.super_iuCodeMessage.m_message.field_2.
                                 _M_local_buf[0]) + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_368);
      std::ios_base::~ios_base((ios_base *)(local_368 + 0x80));
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(aiStack_138);
      iVar6 = local_37c;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8.m_message._M_dataplus._M_p != &local_3d8.m_message.field_2) {
      operator_delete(local_3d8.m_message._M_dataplus._M_p,
                      local_3d8.m_message.field_2._M_allocated_capacity + 1);
    }
    if (bVar8 == false) goto LAB_0010f15b;
    bVar8 = local_378 == 0;
    if (!bVar8) {
      iVar6 = 1;
    }
  }
  if (!bVar8) {
    return iVar6;
  }
  local_374 = 2;
  local_1d8 = *local_370;
  local_1d0 = "--spec";
  pUVar2 = iutest::UnitTestSource::GetInstance();
  iutest::UnitTestSource::Initialize(pUVar2);
  iutest::TestEnv::ParseCommandLine<char_const>(&local_374,&local_1d8);
  iutest::TestEnv::LoadFlagFile();
  pUVar2 = iutest::UnitTestSource::GetInstance();
  iutest::UnitTestSource::SetUpDefaultXmlListener(pUVar2);
  pTVar3 = iutest::TestFlag::GetInstance();
  uVar4 = pTVar3->m_test_flags & 0x8000000;
  local_3b0.m_part_result.super_iuCodeMessage.m_message._M_string_length = 0;
  local_3b0.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[0] = '\0';
  local_3b0.m_part_result.super_iuCodeMessage.m_file =
       (char *)CONCAT71(local_3b0.m_part_result.super_iuCodeMessage.m_file._1_7_,
                        (byte)(uVar4 >> 0x1b));
  local_3b0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar7;
  if (uVar4 == 0) {
    memset((iu_global_format_stringstream *)local_368,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_368);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_3d8.m_message,(internal *)&local_3b0,
               (AssertionResult *)"::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_SPEC)",
               "false","true",(char *)in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b8,local_3d8.m_message._M_dataplus._M_p,&local_3d9);
    local_198 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
    ;
    local_190 = 0x100000040;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)local_1b8,(Fixed *)local_368,false);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8.m_message._M_dataplus._M_p != &local_3d8.m_message.field_2) {
      operator_delete(local_3d8.m_message._M_dataplus._M_p,
                      local_3d8.m_message.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_368);
    std::ios_base::~ios_base((ios_base *)(local_368 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar7) {
    operator_delete(local_3b0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    CONCAT71(local_3b0.m_part_result.super_iuCodeMessage.m_message.field_2.
                             _M_allocated_capacity._1_7_,
                             local_3b0.m_part_result.super_iuCodeMessage.m_message.field_2.
                             _M_local_buf[0]) + 1);
  }
  logger.m_log._M_string_length = 0;
  *logger.m_log._M_dataplus._M_p = '\0';
  pUVar2 = iutest::UnitTestSource::GetInstance();
  local_378 = iutest::UnitTestSource::Run(pUVar2);
  local_368._0_8_ = logger.m_log._M_dataplus._M_p;
  iuutil::StrNotInHelper::Assertion<char[24],char_const*>
            (&local_3d8,(StrNotInHelper *)"\"IUTEST_HAS_TYPED_TEST_P\"","logger.c_str()",
             "IUTEST_HAS_TYPED_TEST_P",(char (*) [24])local_368,in_R9);
  bVar8 = local_3d8.m_result;
  if (local_3d8.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::detail::iuStreamMessage::iuStreamMessage
              ((iuStreamMessage *)local_368,(iuStreamMessage *)local_1b8);
    local_1e0 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b0,local_3d8.m_message._M_dataplus._M_p,&local_3d9);
    local_3b0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
    ;
    local_3b0.m_part_result.super_iuCodeMessage.m_line = 0x44;
    local_3b0.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_3b0,(Fixed *)local_368,false);
    local_37c = local_1e0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar7) {
      operator_delete(local_3b0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      CONCAT71(local_3b0.m_part_result.super_iuCodeMessage.m_message.field_2.
                               _M_allocated_capacity._1_7_,
                               local_3b0.m_part_result.super_iuCodeMessage.m_message.field_2.
                               _M_local_buf[0]) + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_368);
    std::ios_base::~ios_base((ios_base *)(local_368 + 0x80));
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(aiStack_138);
    iVar6 = local_37c;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8.m_message._M_dataplus._M_p != &local_3d8.m_message.field_2) {
    operator_delete(local_3d8.m_message._M_dataplus._M_p,
                    local_3d8.m_message.field_2._M_allocated_capacity + 1);
  }
  if (bVar8 == false) {
LAB_0010f5b9:
    bVar8 = false;
  }
  else {
    local_368._0_8_ = logger.m_log._M_dataplus._M_p;
    iuutil::StrInHelper::Assertion<char[17],char_const*>
              (&local_3d8,(StrInHelper *)"\"IUTEST_HAS_TUPLE\"","logger.c_str()","IUTEST_HAS_TUPLE",
               (char (*) [17])local_368,in_R9);
    bVar8 = local_3d8.m_result;
    if (local_3d8.m_result == false) {
      memset((iu_global_format_stringstream *)local_1b8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b8);
      iutest::detail::iuStreamMessage::iuStreamMessage
                ((iuStreamMessage *)local_368,(iuStreamMessage *)local_1b8);
      local_1e0 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3b0,local_3d8.m_message._M_dataplus._M_p,&local_3d9);
      local_3b0.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
      ;
      local_3b0.m_part_result.super_iuCodeMessage.m_line = 0x45;
      local_3b0.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_3b0,(Fixed *)local_368,false);
      local_37c = local_1e0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar7) {
        operator_delete(local_3b0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        CONCAT71(local_3b0.m_part_result.super_iuCodeMessage.m_message.field_2.
                                 _M_allocated_capacity._1_7_,
                                 local_3b0.m_part_result.super_iuCodeMessage.m_message.field_2.
                                 _M_local_buf[0]) + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_368);
      std::ios_base::~ios_base((ios_base *)(local_368 + 0x80));
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(aiStack_138);
      iVar6 = local_37c;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8.m_message._M_dataplus._M_p != &local_3d8.m_message.field_2) {
      operator_delete(local_3d8.m_message._M_dataplus._M_p,
                      local_3d8.m_message.field_2._M_allocated_capacity + 1);
    }
    if (bVar8 == false) goto LAB_0010f5b9;
    bVar8 = local_378 == 0;
    if (!bVar8) {
      iVar6 = 1;
    }
  }
  paVar5 = &local_3d8.m_message.field_2;
  if (!bVar8) {
    return iVar6;
  }
  local_374 = 3;
  local_1d8 = *local_370;
  local_1d0 = "--feature";
  local_1c8 = "--spec";
  pUVar2 = iutest::UnitTestSource::GetInstance();
  iutest::UnitTestSource::Initialize(pUVar2);
  iutest::TestEnv::ParseCommandLine<char_const>(&local_374,&local_1d8);
  iutest::TestEnv::LoadFlagFile();
  pUVar2 = iutest::UnitTestSource::GetInstance();
  iutest::UnitTestSource::SetUpDefaultXmlListener(pUVar2);
  pTVar3 = iutest::TestFlag::GetInstance();
  uVar4 = pTVar3->m_test_flags & 0x4000000;
  local_3b0.m_part_result.super_iuCodeMessage.m_message._M_string_length = 0;
  local_3b0.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[0] = '\0';
  local_3b0.m_part_result.super_iuCodeMessage.m_file =
       (char *)CONCAT71(local_3b0.m_part_result.super_iuCodeMessage.m_file._1_7_,
                        (byte)(uVar4 >> 0x1a));
  local_3b0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar7;
  if (uVar4 == 0) {
    memset((iu_global_format_stringstream *)local_368,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_368);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_3d8.m_message,(internal *)&local_3b0,
               (AssertionResult *)
               "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_FEATURE)","false","true",
               (char *)in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b8,local_3d8.m_message._M_dataplus._M_p,&local_3d9);
    local_198 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
    ;
    local_190 = 0x10000004e;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)local_1b8,(Fixed *)local_368,false);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8.m_message._M_dataplus._M_p != paVar5) {
      operator_delete(local_3d8.m_message._M_dataplus._M_p,
                      local_3d8.m_message.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_368);
    std::ios_base::~ios_base((ios_base *)(local_368 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar7) {
    operator_delete(local_3b0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    CONCAT71(local_3b0.m_part_result.super_iuCodeMessage.m_message.field_2.
                             _M_allocated_capacity._1_7_,
                             local_3b0.m_part_result.super_iuCodeMessage.m_message.field_2.
                             _M_local_buf[0]) + 1);
  }
  pTVar3 = iutest::TestFlag::GetInstance();
  uVar4 = pTVar3->m_test_flags & 0x8000000;
  local_3b0.m_part_result.super_iuCodeMessage.m_message._M_string_length = 0;
  local_3b0.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[0] = '\0';
  local_3b0.m_part_result.super_iuCodeMessage.m_file =
       (char *)CONCAT71(local_3b0.m_part_result.super_iuCodeMessage.m_file._1_7_,
                        (byte)(uVar4 >> 0x1b));
  local_3b0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar7;
  if (uVar4 == 0) {
    memset((iu_global_format_stringstream *)local_368,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_368);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_3d8.m_message,(internal *)&local_3b0,
               (AssertionResult *)"::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_SPEC)",
               "false","true",(char *)in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b8,local_3d8.m_message._M_dataplus._M_p,&local_3d9);
    local_198 = 
    "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
    ;
    local_190 = 0x10000004f;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)local_1b8,(Fixed *)local_368,false);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8.m_message._M_dataplus._M_p != paVar5) {
      operator_delete(local_3d8.m_message._M_dataplus._M_p,
                      local_3d8.m_message.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_368);
    std::ios_base::~ios_base((ios_base *)(local_368 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar7) {
    operator_delete(local_3b0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    CONCAT71(local_3b0.m_part_result.super_iuCodeMessage.m_message.field_2.
                             _M_allocated_capacity._1_7_,
                             local_3b0.m_part_result.super_iuCodeMessage.m_message.field_2.
                             _M_local_buf[0]) + 1);
  }
  logger.m_log._M_string_length = 0;
  *logger.m_log._M_dataplus._M_p = '\0';
  pUVar2 = iutest::UnitTestSource::GetInstance();
  iVar1 = iutest::UnitTestSource::Run(pUVar2);
  local_370 = (char **)CONCAT44(local_370._4_4_,iVar1);
  local_368._0_8_ = logger.m_log._M_dataplus._M_p;
  iuutil::StrInHelper::Assertion<char[24],char_const*>
            (&local_3d8,(StrInHelper *)"\"IUTEST_HAS_TYPED_TEST_P\"","logger.c_str()",
             "IUTEST_HAS_TYPED_TEST_P",(char (*) [24])local_368,in_R9);
  bVar8 = local_3d8.m_result;
  if (local_3d8.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::detail::iuStreamMessage::iuStreamMessage
              ((iuStreamMessage *)local_368,(iuStreamMessage *)local_1b8);
    local_1e0 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b0,local_3d8.m_message._M_dataplus._M_p,&local_3d9);
    local_3b0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
    ;
    local_3b0.m_part_result.super_iuCodeMessage.m_line = 0x53;
    local_3b0.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_3b0,(Fixed *)local_368,false);
    iVar6 = local_1e0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_3b0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_3b0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      CONCAT71(local_3b0.m_part_result.super_iuCodeMessage.m_message.field_2.
                               _M_allocated_capacity._1_7_,
                               local_3b0.m_part_result.super_iuCodeMessage.m_message.field_2.
                               _M_local_buf[0]) + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_368);
    std::ios_base::~ios_base((ios_base *)(local_368 + 0x80));
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(aiStack_138);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8.m_message._M_dataplus._M_p != &local_3d8.m_message.field_2) {
    operator_delete(local_3d8.m_message._M_dataplus._M_p,
                    local_3d8.m_message.field_2._M_allocated_capacity + 1);
  }
  if (bVar8 != false) {
    local_368._0_8_ = logger.m_log._M_dataplus._M_p;
    iuutil::StrInHelper::Assertion<char[17],char_const*>
              (&local_3d8,(StrInHelper *)"\"IUTEST_HAS_TUPLE\"","logger.c_str()","IUTEST_HAS_TUPLE",
               (char (*) [17])local_368,in_R9);
    if (local_3d8.m_result == false) {
      memset((iu_global_format_stringstream *)local_1b8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b8);
      iutest::detail::iuStreamMessage::iuStreamMessage
                ((iuStreamMessage *)local_368,(iuStreamMessage *)local_1b8);
      local_1e0 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3b0,local_3d8.m_message._M_dataplus._M_p,&local_3d9);
      local_3b0.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/feature_spec_tests.cpp"
      ;
      local_3b0.m_part_result.super_iuCodeMessage.m_line = 0x54;
      local_3b0.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_3b0,(Fixed *)local_368,false);
      iVar6 = local_1e0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_3b0.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_3b0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        CONCAT71(local_3b0.m_part_result.super_iuCodeMessage.m_message.field_2.
                                 _M_allocated_capacity._1_7_,
                                 local_3b0.m_part_result.super_iuCodeMessage.m_message.field_2.
                                 _M_local_buf[0]) + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_368);
      std::ios_base::~ios_base((ios_base *)(local_368 + 0x80));
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(aiStack_138);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8.m_message._M_dataplus._M_p != &local_3d8.m_message.field_2) {
      operator_delete(local_3d8.m_message._M_dataplus._M_p,
                      local_3d8.m_message.field_2._M_allocated_capacity + 1);
    }
    if (local_3d8.m_result != false) {
      bVar8 = (int)local_370 == 0;
      if (!bVar8) {
        iVar6 = 1;
      }
      goto LAB_0010fb3a;
    }
  }
  bVar8 = false;
LAB_0010fb3a:
  if (bVar8) {
    puts("*** Successful ***");
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int main(int argc, char* argv[])
#endif
{
    (void)argc;
    (void)argv;
#if !defined(IUTEST_USE_GTEST)
    ::iutest::detail::iuConsole::SetLogger(&logger);

    {
        int targc = 2;
        DECAL_ARGV("--feature");
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_TRUE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_FEATURE));
        logger.clear();
        const int ret = IUTEST_RUN_ALL_TESTS();
#if IUTEST_HAS_ASSERTION_RETURN
        IUTEST_ASSERT_STRIN   ("IUTEST_HAS_TYPED_TEST_P", logger.c_str()) << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_STRNOTIN("IUTEST_HAS_TUPLE", logger.c_str()) << ::iutest::AssertionReturn<int>(1);
#endif
        if( ret != 0 ) return 1;
    }

    {
        int targc = 2;
        DECAL_ARGV("--spec");
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_TRUE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_SPEC));
        logger.clear();
        const int ret = IUTEST_RUN_ALL_TESTS();
#if IUTEST_HAS_ASSERTION_RETURN
        IUTEST_ASSERT_STRNOTIN("IUTEST_HAS_TYPED_TEST_P", logger.c_str()) << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_STRIN   ("IUTEST_HAS_TUPLE", logger.c_str()) << ::iutest::AssertionReturn<int>(1);
#endif
        if( ret != 0 ) return 1;
    }

    {
        int targc = 3;
        DECAL_ARGV2("--feature", "--spec");
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_TRUE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_FEATURE));
        IUTEST_EXPECT_TRUE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_SPEC));
        logger.clear();
        const int ret = IUTEST_RUN_ALL_TESTS();
#if IUTEST_HAS_ASSERTION_RETURN
        IUTEST_ASSERT_STRIN("IUTEST_HAS_TYPED_TEST_P", logger.c_str()) << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_STRIN("IUTEST_HAS_TUPLE", logger.c_str()) << ::iutest::AssertionReturn<int>(1);
#endif
        if( ret != 0 ) return 1;
    }
#endif
    printf("*** Successful ***\n");
    return 0;
}